

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444_writer.c
# Opt level: O3

rfc5444_writer_address *
rfc5444_writer_add_address
          (rfc5444_writer *writer,rfc5444_writer_message *msg,netaddr *naddr,_Bool mandatory)

{
  list_entity *plVar1;
  undefined8 uVar2;
  uint8_t uVar3;
  avl_node *paVar4;
  rfc5444_writer_address *prVar5;
  
  if (writer->_state != RFC5444_WRITER_ADD_ADDRESSES) {
    __assert_fail("writer->_state == RFC5444_WRITER_ADD_ADDRESSES",
                  "/workspace/llm4binary/github/license_c_cmakelists/OLSR[P]OONF/src/librfc5444/rfc5444_writer.c"
                  ,0xf3,
                  "struct rfc5444_writer_address *rfc5444_writer_add_address(struct rfc5444_writer *, struct rfc5444_writer_message *, const struct netaddr *, _Bool)"
                 );
  }
  paVar4 = avl_find(&msg->_addr_tree,naddr);
  if (paVar4 == (avl_node *)0x0) {
    prVar5 = (*writer->malloc_address_entry)();
    if (prVar5 == (rfc5444_writer_address *)0x0) {
      return (rfc5444_writer_address *)0x0;
    }
    uVar3 = naddr->_prefix_len;
    (prVar5->address)._type = naddr->_type;
    (prVar5->address)._prefix_len = uVar3;
    uVar2 = *(undefined8 *)(naddr->_addr + 8);
    *(undefined8 *)(prVar5->address)._addr = *(undefined8 *)naddr->_addr;
    *(undefined8 *)((prVar5->address)._addr + 8) = uVar2;
    plVar1 = *(list_entity **)(msg->orig_addr + (ulong)mandatory * 0x10 + 0x20);
    (prVar5->_addr_list_node).next =
         (list_entity *)(msg->orig_addr + (ulong)mandatory * 0x10 + 0x18);
    (prVar5->_addr_list_node).prev = plVar1;
    *(list_entity **)(msg->orig_addr + (ulong)mandatory * 0x10 + 0x20) = &prVar5->_addr_list_node;
    plVar1->next = &prVar5->_addr_list_node;
    (prVar5->_addr_tree_node).key = &prVar5->address;
    avl_insert(&msg->_addr_tree,&prVar5->_addr_tree_node);
    avl_init(&prVar5->_addrtlv_tree,avl_comp_uint32,true);
  }
  else {
    prVar5 = (rfc5444_writer_address *)(paVar4 + -1);
  }
  prVar5->_mandatory_addr = (_Bool)(prVar5->_mandatory_addr | mandatory);
  return prVar5;
}

Assistant:

struct rfc5444_writer_address *
rfc5444_writer_add_address(struct rfc5444_writer *writer __attribute__((unused)), struct rfc5444_writer_message *msg,
  const struct netaddr *naddr, bool mandatory) {
  struct rfc5444_writer_address *address;

#if WRITER_STATE_MACHINE == true
  assert(writer->_state == RFC5444_WRITER_ADD_ADDRESSES);
#endif

  address = avl_find_element(&msg->_addr_tree, naddr, address, _addr_tree_node);
  if (address == NULL) {
    if ((address = writer->malloc_address_entry()) == NULL) {
      return NULL;
    }

    memcpy(&address->address, naddr, sizeof(*naddr));

    /* add address to address list */
    if (mandatory) {
      list_add_tail(&msg->_addr_head, &address->_addr_list_node);
    }
    else {
      list_add_tail(&msg->_non_mandatory_addr_head, &address->_addr_list_node);
    }

    /* add address into message address tree */
    address->_addr_tree_node.key = &address->address;
    avl_insert(&msg->_addr_tree, &address->_addr_tree_node);

    avl_init(&address->_addrtlv_tree, avl_comp_uint32, true);
  }

  address->_mandatory_addr |= mandatory;

  return address;
}